

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_absolute_schema_nodeid(char *nodeid,lys_module *module,int ret_nodetype,lys_node **ret)

{
  lys_module *module_00;
  lys_module *abs_start_mod;
  int is_relative;
  int mod_name_len;
  int nam_len;
  int r;
  lys_node *start_parent;
  lys_node *sibling;
  char *id;
  char *mod_name;
  char *name;
  lys_node **ret_local;
  lys_module *plStack_20;
  int ret_nodetype_local;
  lys_module *module_local;
  char *nodeid_local;
  
  abs_start_mod._0_4_ = -1;
  name = (char *)ret;
  ret_local._4_4_ = ret_nodetype;
  plStack_20 = module;
  module_local = (lys_module *)nodeid;
  if (((nodeid == (char *)0x0) || (module == (lys_module *)0x0)) || (ret == (lys_node **)0x0)) {
    __assert_fail("nodeid && module && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c3,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  if (((ret_nodetype & 0x3000U) != 0) || ((ret_nodetype != 0x800 && ((ret_nodetype & 0x800U) != 0)))
     ) {
    __assert_fail("!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c4,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  _nam_len = (lys_node *)0x0;
  sibling = (lys_node *)nodeid;
  mod_name_len = parse_schema_nodeid(nodeid,&id,(int *)((long)&abs_start_mod + 4),&mod_name,
                                     &is_relative,(int *)&abs_start_mod,(int *)0x0,(int *)0x0,0);
  if (mod_name_len < 1) {
    nodeid_local._4_4_ = (((int)sibling - (int)module_local) - mod_name_len) + 1;
  }
  else {
    sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
    if ((int)abs_start_mod == 0) {
      module_00 = lyp_get_module(plStack_20,(char *)0x0,0,id,abs_start_mod._4_4_,0);
      if (module_00 != (lys_module *)0x0) {
        do {
          start_parent = (lys_node *)0x0;
          while (start_parent = lys_getnext(start_parent,_nam_len,module_00,0x10f),
                start_parent != (lys_node *)0x0) {
            mod_name_len = schema_nodeid_siblingcheck
                                     (start_parent,plStack_20,id,abs_start_mod._4_4_,mod_name,
                                      is_relative);
            if (mod_name_len == 0) {
              if (*(char *)&sibling->name != '\0') {
                _nam_len = start_parent;
                break;
              }
              if ((start_parent->nodetype & ret_local._4_4_) != LYS_UNKNOWN) {
                *(lys_node **)name = start_parent;
                return 0;
              }
            }
            else if (mod_name_len != 1) {
              return -1;
            }
          }
          if (start_parent == (lys_node *)0x0) {
            name[0] = '\0';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            return 0;
          }
          mod_name_len = parse_schema_nodeid((char *)sibling,&id,(int *)((long)&abs_start_mod + 4),
                                             &mod_name,&is_relative,(int *)&abs_start_mod,(int *)0x0
                                             ,(int *)0x0,0);
          if (mod_name_len < 1) {
            return (((int)sibling - (int)module_local) - mod_name_len) + 1;
          }
          sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
        } while( true );
      }
      nodeid_local._4_4_ = -1;
    }
    else {
      nodeid_local._4_4_ = -1;
    }
  }
  return nodeid_local._4_4_;
}

Assistant:

int
resolve_absolute_schema_nodeid(const char *nodeid, const struct lys_module *module, int ret_nodetype,
                               const struct lys_node **ret)
{
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1;
    const struct lys_module *abs_start_mod;

    assert(nodeid && module && ret);
    assert(!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING)));

    id = nodeid;
    start_parent = NULL;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
        return ((id - nodeid) - r) + 1;
    }
    id += r;

    if (is_relative) {
        return -1;
    }

    abs_start_mod = lyp_get_module(module, NULL, 0, mod_name, mod_name_len, 0);
    if (!abs_start_mod) {
        return -1;
    }

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, abs_start_mod, LYS_GETNEXT_WITHCHOICE
                | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_WITHGROUPING | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, module, mod_name, mod_name_len, name, nam_len);
            if (r == 0) {
                if (!id[0]) {
                    if (!(sibling->nodetype & ret_nodetype)) {
                        /* wrong node type, too bad */
                        continue;
                    }
                    *ret = sibling;
                    return EXIT_SUCCESS;
                }
                start_parent = sibling;
                break;
            } else if (r == 1) {
                continue;
            } else {
                return -1;
            }
        }

        /* no match */
        if (!sibling) {
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
            return ((id - nodeid) - r) + 1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(module->ctx);
    return -1;
}